

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch2.hpp
# Opt level: O0

Totals * __thiscall
Catch::Totals::delta(Totals *__return_storage_ptr__,Totals *this,Totals *prevTotals)

{
  Totals *diff;
  Totals *prevTotals_local;
  Totals *this_local;
  
  operator-(__return_storage_ptr__,this,prevTotals);
  if ((__return_storage_ptr__->assertions).failed == 0) {
    if ((__return_storage_ptr__->assertions).failedButOk == 0) {
      (__return_storage_ptr__->testCases).passed = (__return_storage_ptr__->testCases).passed + 1;
    }
    else {
      (__return_storage_ptr__->testCases).failedButOk =
           (__return_storage_ptr__->testCases).failedButOk + 1;
    }
  }
  else {
    (__return_storage_ptr__->testCases).failed = (__return_storage_ptr__->testCases).failed + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

Totals Totals::delta( Totals const& prevTotals ) const {
        Totals diff = *this - prevTotals;
        if( diff.assertions.failed > 0 )
            ++diff.testCases.failed;
        else if( diff.assertions.failedButOk > 0 )
            ++diff.testCases.failedButOk;
        else
            ++diff.testCases.passed;
        return diff;
    }